

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

long cs_impl::to_integer_if<std::pair<cs_impl::any,_cs_impl::any>,_false>::to_integer
               (pair<cs_impl::any,_cs_impl::any> *param_1)

{
  error *this;
  allocator local_31;
  string local_30;
  
  this = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000M",&local_31);
  cov::error::error(this,&local_30);
  __cxa_throw(this,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

static long to_integer(const T &)
		{
			throw cov::error("E000M");
		}